

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_conn.cpp
# Opt level: O2

void __thiscall CNetConnection::Disconnect(CNetConnection *this,char *pReason)

{
  int iVar1;
  
  if (this->m_State != 0) {
    if (this->m_RemoteClosed == 0) {
      if (pReason == (char *)0x0) {
        SendControl(this,4,(void *)0x0,0);
        this->m_ErrorString[0] = '\0';
      }
      else {
        iVar1 = str_length(pReason);
        SendControl(this,4,pReason,iVar1 + 1);
        if (this->m_ErrorString != pReason) {
          str_copy(this->m_ErrorString,pReason,0x100);
        }
      }
    }
    Reset(this);
    return;
  }
  return;
}

Assistant:

void CNetConnection::Disconnect(const char *pReason)
{
	if(State() == NET_CONNSTATE_OFFLINE)
		return;

	if(m_RemoteClosed == 0)
	{
		if(pReason)
			SendControl(NET_CTRLMSG_CLOSE, pReason, str_length(pReason)+1);
		else
			SendControl(NET_CTRLMSG_CLOSE, 0, 0);

		if(pReason != m_ErrorString)
		{
			if(pReason)
				str_copy(m_ErrorString, pReason, sizeof(m_ErrorString));
			else
				m_ErrorString[0] = 0;
		}
	}

	Reset();
}